

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O0

void yprc_type(lys_ypr_ctx *pctx,lysc_type *type)

{
  ly_out *out;
  uint64_t uVar1;
  char *pcVar2;
  ulong local_c0;
  ulong local_b0;
  ulong local_a0;
  uint local_7c;
  lysc_type_union *un;
  lysc_type_leafref *lr;
  lysc_type_instanceid *inst;
  lysc_type_identityref *ident;
  lysc_type_dec *dec;
  lysc_type_bits *bits;
  lysc_type_str *str;
  lysc_type_num *num;
  lysc_type_bin *bin;
  ulong uStack_20;
  ly_bool flag;
  uint64_t u;
  lysc_type *type_local;
  lys_ypr_ctx *pctx_local;
  
  bin._7_1_ = '\0';
  out = (pctx->field_0).field_0.out;
  if (((pctx->field_0).field_0.options & 2) == 0) {
    local_7c = (uint)(pctx->field_0).field_0.level << 1;
  }
  else {
    local_7c = 0;
  }
  u = (uint64_t)type;
  type_local = (lysc_type *)pctx;
  pcVar2 = lys_datatype2str(type->basetype);
  ly_print_(out,"%*stype %s",(ulong)local_7c,"",pcVar2);
  *(short *)&type_local->exts = *(short *)&type_local->exts + 1;
  yprc_extension_instances
            ((lys_ypr_ctx *)type_local,LY_STMT_TYPE,'\0',*(lysc_ext_instance **)(u + 8),
             (ly_bool *)((long)&bin + 7));
  uVar1 = u;
  switch(*(undefined4 *)(u + 0x18)) {
  case 1:
    yprc_range((lys_ypr_ctx *)type_local,*(lysc_range **)(u + 0x20),*(LY_DATA_TYPE *)(u + 0x18),
               (ly_bool *)((long)&bin + 7));
    break;
  case 2:
  case 3:
  case 4:
  case 5:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
    yprc_range((lys_ypr_ctx *)type_local,*(lysc_range **)(u + 0x20),*(LY_DATA_TYPE *)(u + 0x18),
               (ly_bool *)((long)&bin + 7));
    break;
  case 6:
    yprc_range((lys_ypr_ctx *)type_local,*(lysc_range **)(u + 0x20),*(LY_DATA_TYPE *)(u + 0x18),
               (ly_bool *)((long)&bin + 7));
    uStack_20 = 0;
    while( true ) {
      if (*(long *)(uVar1 + 0x28) == 0) {
        local_a0 = 0;
      }
      else {
        local_a0 = *(ulong *)(*(long *)(uVar1 + 0x28) + -8);
      }
      if (local_a0 <= uStack_20) break;
      yprc_pattern((lys_ypr_ctx *)type_local,
                   *(lysc_pattern **)(*(long *)(uVar1 + 0x28) + uStack_20 * 8),
                   (ly_bool *)((long)&bin + 7));
      uStack_20 = uStack_20 + 1;
    }
    break;
  case 7:
  case 0xb:
    yprc_bits_enum((lys_ypr_ctx *)type_local,*(lysc_type_bitenum_item **)(u + 0x20),
                   *(LY_DATA_TYPE *)(u + 0x18),(ly_bool *)((long)&bin + 7));
    break;
  case 8:
  case 10:
    break;
  case 9:
    ypr_open((ly_out *)type_local->name,(ly_bool *)((long)&bin + 7));
    ypr_unsigned((lys_ypr_ctx *)type_local,LY_STMT_FRACTION_DIGITS,'\0',*(void **)(u + 8),
                 (ulong)*(byte *)(uVar1 + 0x20),(ly_bool *)((long)&bin + 7));
    yprc_range((lys_ypr_ctx *)type_local,*(lysc_range **)(uVar1 + 0x28),
               *(LY_DATA_TYPE *)(uVar1 + 0x18),(ly_bool *)((long)&bin + 7));
    break;
  case 0xc:
    uStack_20 = 0;
    while( true ) {
      if (*(long *)(uVar1 + 0x20) == 0) {
        local_b0 = 0;
      }
      else {
        local_b0 = *(ulong *)(*(long *)(uVar1 + 0x20) + -8);
      }
      if (local_b0 <= uStack_20) break;
      ypr_open((ly_out *)type_local->name,(ly_bool *)((long)&bin + 7));
      ypr_substmt((lys_ypr_ctx *)type_local,LY_STMT_BASE,(uint8_t)uStack_20,
                  (char *)**(undefined8 **)(*(long *)(uVar1 + 0x20) + uStack_20 * 8),'\0',
                  *(void **)(u + 8));
      uStack_20 = uStack_20 + 1;
    }
    break;
  case 0xd:
    ypr_open((ly_out *)type_local->name,(ly_bool *)((long)&bin + 7));
    pcVar2 = "false";
    if (*(char *)(uVar1 + 0x20) != '\0') {
      pcVar2 = "true";
    }
    ypr_substmt((lys_ypr_ctx *)type_local,LY_STMT_REQUIRE_INSTANCE,'\0',pcVar2,'\0',
                *(void **)(uVar1 + 8));
    break;
  case 0xe:
    ypr_open((ly_out *)type_local->name,(ly_bool *)((long)&bin + 7));
    ypr_substmt((lys_ypr_ctx *)type_local,LY_STMT_PATH,'\0',
                *(char **)(*(long *)(uVar1 + 0x20) + 0x28),'\0',*(void **)(uVar1 + 8));
    pcVar2 = "false";
    if (*(char *)(uVar1 + 0x38) != '\0') {
      pcVar2 = "true";
    }
    ypr_substmt((lys_ypr_ctx *)type_local,LY_STMT_REQUIRE_INSTANCE,'\0',pcVar2,'\0',
                *(void **)(uVar1 + 8));
    yprc_type((lys_ypr_ctx *)type_local,*(lysc_type **)(uVar1 + 0x30));
    break;
  case 0xf:
    uStack_20 = 0;
    while( true ) {
      if (*(long *)(uVar1 + 0x20) == 0) {
        local_c0 = 0;
      }
      else {
        local_c0 = *(ulong *)(*(long *)(uVar1 + 0x20) + -8);
      }
      if (local_c0 <= uStack_20) break;
      ypr_open((ly_out *)type_local->name,(ly_bool *)((long)&bin + 7));
      yprc_type((lys_ypr_ctx *)type_local,*(lysc_type **)(*(long *)(uVar1 + 0x20) + uStack_20 * 8));
      uStack_20 = uStack_20 + 1;
    }
    break;
  default:
    ly_log((ly_ctx *)type_local->plugin->id,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_yang.c",
           0x428);
  }
  *(short *)&type_local->exts = *(short *)&type_local->exts + -1;
  ypr_close((lys_ypr_ctx *)type_local,bin._7_1_);
  return;
}

Assistant:

static void
yprc_type(struct lys_ypr_ctx *pctx, const struct lysc_type *type)
{
    LY_ARRAY_COUNT_TYPE u;
    ly_bool flag = 0;

    ly_print_(pctx->out, "%*stype %s", INDENT, lys_datatype2str(type->basetype));
    LEVEL++;

    yprc_extension_instances(pctx, LY_STMT_TYPE, 0, type->exts, &flag);

    switch (type->basetype) {
    case LY_TYPE_BINARY: {
        struct lysc_type_bin *bin = (struct lysc_type_bin *)type;

        yprc_range(pctx, bin->length, type->basetype, &flag);
        break;
    }
    case LY_TYPE_UINT8:
    case LY_TYPE_UINT16:
    case LY_TYPE_UINT32:
    case LY_TYPE_UINT64:
    case LY_TYPE_INT8:
    case LY_TYPE_INT16:
    case LY_TYPE_INT32:
    case LY_TYPE_INT64: {
        struct lysc_type_num *num = (struct lysc_type_num *)type;

        yprc_range(pctx, num->range, type->basetype, &flag);
        break;
    }
    case LY_TYPE_STRING: {
        struct lysc_type_str *str = (struct lysc_type_str *)type;

        yprc_range(pctx, str->length, type->basetype, &flag);
        LY_ARRAY_FOR(str->patterns, u) {
            yprc_pattern(pctx, str->patterns[u], &flag);
        }
        break;
    }
    case LY_TYPE_BITS:
    case LY_TYPE_ENUM: {
        /* bits and enums structures are compatible */
        struct lysc_type_bits *bits = (struct lysc_type_bits *)type;

        yprc_bits_enum(pctx, bits->bits, type->basetype, &flag);
        break;
    }
    case LY_TYPE_BOOL:
    case LY_TYPE_EMPTY:
        /* nothing to do */
        break;
    case LY_TYPE_DEC64: {
        struct lysc_type_dec *dec = (struct lysc_type_dec *)type;

        ypr_open(pctx->out, &flag);
        ypr_unsigned(pctx, LY_STMT_FRACTION_DIGITS, 0, type->exts, dec->fraction_digits, &flag);
        yprc_range(pctx, dec->range, dec->basetype, &flag);
        break;
    }
    case LY_TYPE_IDENT: {
        struct lysc_type_identityref *ident = (struct lysc_type_identityref *)type;

        LY_ARRAY_FOR(ident->bases, u) {
            ypr_open(pctx->out, &flag);
            ypr_substmt(pctx, LY_STMT_BASE, u, ident->bases[u]->name, 0, type->exts);
        }
        break;
    }
    case LY_TYPE_INST: {
        struct lysc_type_instanceid *inst = (struct lysc_type_instanceid *)type;

        ypr_open(pctx->out, &flag);
        ypr_substmt(pctx, LY_STMT_REQUIRE_INSTANCE, 0, inst->require_instance ? "true" : "false", 0, inst->exts);
        break;
    }
    case LY_TYPE_LEAFREF: {
        struct lysc_type_leafref *lr = (struct lysc_type_leafref *)type;

        ypr_open(pctx->out, &flag);
        ypr_substmt(pctx, LY_STMT_PATH, 0, lr->path->expr, 0, lr->exts);
        ypr_substmt(pctx, LY_STMT_REQUIRE_INSTANCE, 0, lr->require_instance ? "true" : "false", 0, lr->exts);
        yprc_type(pctx, lr->realtype);
        break;
    }
    case LY_TYPE_UNION: {
        struct lysc_type_union *un = (struct lysc_type_union *)type;

        LY_ARRAY_FOR(un->types, u) {
            ypr_open(pctx->out, &flag);
            yprc_type(pctx, un->types[u]);
        }
        break;
    }
    default:
        LOGINT(pctx->module->ctx);
    }

    LEVEL--;
    ypr_close(pctx, flag);
}